

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<7,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  Matrix<float,_2,_2> blockD;
  Matrix<float,_2,_2> blockC;
  Matrix<float,_2,_2> invA;
  Matrix<float,_2,_2> zeroMat;
  Matrix<float,_2,_2> schurComplement;
  Type in0;
  Matrix<float,_2,_2> blockB;
  Matrix<float,_2,_2> blockA;
  Matrix<float,_2,_2> matB;
  Matrix<float,_2,_2> matC;
  float nullField [4];
  Matrix<float,_2,_2> matD;
  float areaD [4];
  float areaC [4];
  float areaB [4];
  float areaA [4];
  Matrix<float,_2,_2> local_1f8;
  Matrix<float,_2,_2> local_1e8;
  Matrix<float,_2,_2> local_1d8;
  Matrix<float,_2,_2> local_1c8;
  Matrix<float,_2,_2> local_1b8;
  Mat4 local_1a8;
  Matrix<float,_2,_2> local_168;
  Matrix<float,_2,_2> local_158;
  Matrix<float,_2,_2> local_148;
  Matrix<float,_2,_2> local_138;
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8 [5];
  Matrix<float,_2,_2> local_d4;
  MatrixCaseUtils local_c4 [12];
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  Matrix<float,_4,_4> local_70;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
              (&local_1a8,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix(&local_1a8,(float *)sr::(anonymous_namespace)::s_constInMat4x4)
    ;
  }
  local_88 = local_1a8.m_data.m_data[0].m_data[0];
  local_84 = local_1a8.m_data.m_data[1].m_data[0];
  local_80 = local_1a8.m_data.m_data[0].m_data[1];
  local_7c = local_1a8.m_data.m_data[1].m_data[1];
  local_98 = local_1a8.m_data.m_data[2].m_data[0];
  local_94 = local_1a8.m_data.m_data[3].m_data[0];
  local_90 = local_1a8.m_data.m_data[2].m_data[1];
  local_8c = local_1a8.m_data.m_data[3].m_data[1];
  local_a8 = local_1a8.m_data.m_data[0].m_data[2];
  local_a4 = local_1a8.m_data.m_data[1].m_data[2];
  local_a0 = local_1a8.m_data.m_data[0].m_data[3];
  local_9c = local_1a8.m_data.m_data[1].m_data[3];
  local_b8 = local_1a8.m_data.m_data[2].m_data[2];
  local_b4 = local_1a8.m_data.m_data[3].m_data[2];
  local_b0 = local_1a8.m_data.m_data[2].m_data[3];
  local_ac = local_1a8.m_data.m_data[3].m_data[3];
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  local_e8[3] = 0.0;
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)local_128,&local_88);
  inverse<2>((MatrixCaseUtils *)&local_1d8,(Matrix<float,_2,_2> *)local_128);
  tcu::Matrix<float,_2,_2>::Matrix(&local_148,&local_98);
  tcu::Matrix<float,_2,_2>::Matrix(&local_138,&local_a8);
  tcu::Matrix<float,_2,_2>::Matrix(&local_d4,&local_b8);
  tcu::operator*((tcu *)&local_158,&local_138,&local_1d8);
  tcu::operator*((tcu *)&local_1c8,&local_158,&local_148);
  tcu::operator-((tcu *)local_128,&local_d4,&local_1c8);
  inverse<2>((MatrixCaseUtils *)&local_1b8,(Matrix<float,_2,_2> *)local_128);
  tcu::Matrix<float,_2,_2>::Matrix(&local_1c8,local_e8);
  tcu::operator*((tcu *)&local_1f8,&local_1d8,&local_148);
  tcu::operator*((tcu *)&local_1e8,&local_1f8,&local_1b8);
  tcu::operator*((tcu *)&local_168,&local_1e8,&local_138);
  tcu::operator*((tcu *)local_128,&local_168,&local_1d8);
  tcu::operator+((tcu *)&local_158,&local_1d8,(Matrix<float,_2,_2> *)local_128);
  tcu::operator-((tcu *)&local_1e8,&local_1c8,&local_1d8);
  tcu::operator*((tcu *)local_128,&local_1e8,&local_148);
  tcu::operator*((tcu *)&local_168,(Matrix<float,_2,_2> *)local_128,&local_1b8);
  tcu::operator-((tcu *)&local_1f8,&local_1c8,&local_1b8);
  tcu::operator*((tcu *)local_128,&local_1f8,&local_138);
  tcu::operator*((tcu *)&local_1e8,(Matrix<float,_2,_2> *)local_128,&local_1d8);
  tcu::Matrix<float,_2,_2>::Matrix(&local_1f8,&local_1b8);
  local_118 = local_158.m_data.m_data[0].m_data[1];
  fStack_114 = local_158.m_data.m_data[1].m_data[1];
  fStack_110 = local_168.m_data.m_data[0].m_data[1];
  fStack_10c = local_168.m_data.m_data[1].m_data[1];
  local_f8 = local_1e8.m_data.m_data[0].m_data[1];
  fStack_f4 = local_1e8.m_data.m_data[1].m_data[1];
  fStack_f0 = local_1f8.m_data.m_data[0].m_data[1];
  fStack_ec = local_1f8.m_data.m_data[1].m_data[1];
  local_108 = local_1e8.m_data.m_data[0].m_data[0];
  fStack_104 = local_1e8.m_data.m_data[1].m_data[0];
  fStack_100 = local_1f8.m_data.m_data[0].m_data[0];
  fStack_fc = local_1f8.m_data.m_data[1].m_data[0];
  tcu::Matrix<float,_4,_4>::Matrix(&local_70,(float *)local_128);
  reduceToVec3(local_c4,&local_70);
  local_128._0_8_ = &evalCtx->color;
  local_128._8_4_ = 0.0;
  local_128._12_4_ = 1.4013e-45;
  local_118 = 2.8026e-45;
  tcu::VecAccess<float,_4,_3>::operator=
            ((VecAccess<float,_4,_3> *)local_128,(Vector<float,_3> *)local_c4);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(inverse(in0));
	}